

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s2_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  pointer pfVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  void *pvVar15;
  long lVar16;
  int iVar17;
  void *pvVar18;
  void *pvVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    pvVar7 = _kernel->data;
    pvVar8 = _bias->data;
    iVar6 = bottom_blob->w;
    lVar11 = (long)((iVar6 - iVar4) * 2);
    lVar13 = 0;
    do {
      if (pvVar8 == (void *)0x0) {
        fVar22 = 0.0;
      }
      else {
        fVar22 = *(float *)((long)pvVar8 + lVar13 * 4);
      }
      if (0 < iVar5) {
        pvVar15 = (void *)(top_blob->cstep * lVar13 * top_blob->elemsize + (long)top_blob->data);
        pfVar9 = (scales_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar1 = pfVar9[lVar13 * 2];
        fVar2 = pfVar9[lVar13 * 2 + 1];
        pvVar18 = (void *)(bottom_blob->cstep * lVar13 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar10 = lVar13 * 9;
        pvVar19 = (void *)((long)pvVar18 + (long)iVar6 * 2);
        lVar16 = (long)pvVar18 + (long)iVar6;
        iVar14 = 0;
        do {
          if (0 < iVar4) {
            lVar20 = 0;
            lVar12 = 0;
            iVar17 = iVar4 + 1;
            do {
              fVar21 = roundf(((float)((int)*(char *)((long)pvVar7 + lVar10 + 8) *
                                       (int)*(char *)((long)pvVar19 + lVar20 * 2 + 2) +
                                       (int)*(char *)((long)pvVar7 + lVar10 + 7) *
                                       (int)*(char *)((long)pvVar19 + lVar20 * 2 + 1) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 6) *
                                      (int)*(char *)((long)pvVar19 + lVar20 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 5) *
                                      (int)*(char *)(lVar16 + 2 + lVar20 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 4) *
                                      (int)*(char *)(lVar16 + 1 + lVar20 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 3) *
                                      (int)*(char *)(lVar16 + lVar20 * 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 2) *
                                      (int)*(char *)((long)pvVar18 + lVar20 * 2 + 2) +
                                      (int)*(char *)((long)pvVar7 + lVar10 + 1) *
                                      (int)*(char *)((long)pvVar18 + lVar20 * 2 + 1) +
                                      (int)*(char *)((long)pvVar7 + lVar10) *
                                      (int)*(char *)((long)pvVar18 + lVar20 * 2)) * fVar1 + fVar22)
                              * fVar2);
              if (fVar21 <= -128.0) {
                fVar21 = -128.0;
              }
              if (127.0 <= fVar21) {
                fVar21 = 127.0;
              }
              *(char *)((long)pvVar15 + lVar20) = (char)(int)fVar21;
              iVar17 = iVar17 + -1;
              lVar12 = lVar12 + -2;
              lVar20 = lVar20 + 1;
            } while (1 < iVar17);
            pvVar19 = (void *)((long)pvVar19 - lVar12);
            lVar16 = lVar16 - lVar12;
            pvVar18 = (void *)((long)pvVar18 - lVar12);
            pvVar15 = (void *)((long)pvVar15 + lVar20);
          }
          pvVar18 = (void *)((long)pvVar18 + lVar11);
          lVar16 = lVar16 + lVar11;
          pvVar19 = (void *)((long)pvVar19 + lVar11);
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar5);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, const Mat &_bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char *outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2*p];      
        const float scale_requant_out = scales_requant[2*p+1]; 

        const signed char *kernel0 = (const signed char *)kernel + p * 9;

        const signed char *img0 = bottom_blob.channel(p);
        const signed char *r0 = img0;
        const signed char *r1 = img0 + w;
        const signed char *r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}